

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O3

void CreateBackwardReferencesNH55
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  uint8_t *puVar3;
  long lVar4;
  PreparedDictionary *pPVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  size_t sVar10;
  PreparedDictionary *pPVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  ushort uVar15;
  uint32_t *puVar16;
  uint uVar17;
  uint8_t *s1_orig;
  uint8_t *puVar18;
  long lVar19;
  PreparedDictionary *pPVar20;
  byte bVar21;
  ulong uVar22;
  PreparedDictionary *pPVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  PreparedDictionary *pPVar28;
  ulong uVar29;
  uint uVar30;
  uint8_t uVar31;
  uint uVar32;
  PreparedDictionary *pPVar33;
  long lVar34;
  undefined1 *puVar35;
  ushort uVar36;
  uint uVar37;
  PreparedDictionary *pPVar38;
  long lVar39;
  long lVar40;
  uint8_t *puVar41;
  ulong uVar42;
  PreparedDictionary *pPVar43;
  uint8_t *puVar44;
  undefined1 *puVar45;
  ulong uVar46;
  uint8_t *puVar47;
  ulong local_148;
  PreparedDictionary *local_140;
  PreparedDictionary *local_118;
  ulong local_108;
  ulong local_100;
  size_t *local_f0;
  ulong local_e8;
  int local_dc;
  ulong local_c0;
  ulong auStack_58 [5];
  
  pPVar5 = (PreparedDictionary *)((position - 7) + num_bytes);
  pPVar38 = (PreparedDictionary *)position;
  if (7 < num_bytes) {
    pPVar38 = pPVar5;
  }
  lVar39 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar39 = 0x40;
  }
  local_148 = *(ulong *)dist_cache;
  puVar2 = (undefined1 *)(position + num_bytes);
  if (puVar2 <= (undefined1 *)(position + 8)) {
    local_f0 = last_insert_len;
LAB_01d14bee:
    *(undefined1 **)dist_cache = puVar2 + (local_148 - position);
    *(long *)commands = *(long *)commands + ((long)local_f0 - (long)last_insert_len >> 4);
    return;
  }
  pPVar33 = (PreparedDictionary *)((1L << (literal_context_lut[8] & 0x3f)) - 0x10);
  lVar8 = *(long *)(literal_context_lut + 0x10);
  lVar9 = *(long *)(literal_context_lut + 0x60);
  pPVar28 = (PreparedDictionary *)(lVar39 + position);
  sVar10 = (params->dictionary).compound.num_chunks;
  uVar14 = (uint)ringbuffer_mask;
  lVar4 = position - 1;
  local_f0 = last_insert_len;
  pPVar43 = (PreparedDictionary *)position;
LAB_01d13d80:
  uVar22 = (long)puVar2 - (long)pPVar43;
  pPVar23 = pPVar33;
  if (pPVar43 < pPVar33) {
    pPVar23 = pPVar43;
  }
  uVar42 = (ulong)pPVar43 & ringbuffer_mask;
  puVar3 = ringbuffer + uVar42;
  uVar31 = ringbuffer[uVar42];
  local_118 = (PreparedDictionary *)(long)*(int *)(hasher->common).extra;
  local_108 = 0x7e4;
  if ((pPVar43 <= (PreparedDictionary *)((long)pPVar43 - (long)local_118)) ||
     (uVar17 = (uint)(PreparedDictionary *)((long)pPVar43 - (long)local_118) & uVar14,
     uVar31 != ringbuffer[uVar17])) {
    local_118 = (PreparedDictionary *)0x0;
    local_e8 = 0;
    goto LAB_01d13eaf;
  }
  puVar18 = ringbuffer + uVar17;
  uVar26 = uVar22;
  puVar44 = puVar3;
  puVar47 = puVar18;
  if (7 < uVar22) {
    lVar40 = 0;
    lVar25 = 0;
LAB_01d13df1:
    if (*(ulong *)(puVar3 + lVar40) == *(ulong *)(puVar18 + lVar40)) goto code_r0x01d13dfe;
    uVar29 = *(ulong *)(puVar18 + lVar40) ^ *(ulong *)(puVar3 + lVar40);
    uVar26 = 0;
    if (uVar29 != 0) {
      for (; (uVar29 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
      }
    }
    local_e8 = (uVar26 >> 3 & 0x1fffffff) - lVar25;
    goto LAB_01d13e6e;
  }
  goto LAB_01d13e23;
code_r0x01d13dfe:
  lVar40 = lVar40 + 8;
  lVar19 = uVar22 + lVar25;
  lVar25 = lVar25 + -8;
  if (lVar19 - 8U < 8) goto code_r0x01d13e14;
  goto LAB_01d13df1;
code_r0x01d13e14:
  puVar47 = puVar18 + -lVar25;
  puVar44 = puVar3 + -lVar25;
  uVar26 = lVar25 + uVar22;
LAB_01d13e23:
  if (uVar26 != 0) {
    uVar29 = 0;
    do {
      uVar46 = uVar29;
      if (puVar47[uVar29] != puVar44[uVar29]) break;
      uVar29 = uVar29 + 1;
      uVar46 = uVar26;
    } while (uVar26 != uVar29);
    puVar47 = puVar47 + uVar46;
  }
  local_e8 = (long)puVar47 - (long)puVar18;
LAB_01d13e6e:
  if ((local_e8 < 4) || (uVar26 = local_e8 * 0x87 + 0x78f, uVar26 < 0x7e5)) {
    local_118 = (PreparedDictionary *)0x0;
    local_e8 = 0;
  }
  else {
    uVar31 = puVar3[local_e8];
    local_108 = uVar26;
  }
LAB_01d13eaf:
  uVar17 = (uint)((ulong)(*(long *)(ringbuffer + uVar42) * -0x1ca5842ca8642d00) >> 0x2c);
  lVar19 = 0;
  lVar25 = 0;
  lVar40 = 1;
  do {
    auStack_58[lVar19] = lVar25 * 8 + (ulong)uVar17 & 0xfffff;
    auStack_58[lVar19 + 1] = lVar40 * 8 + (ulong)uVar17 & 0xfffff;
    lVar19 = lVar19 + 2;
    lVar25 = lVar25 + 2;
    lVar40 = lVar40 + 2;
  } while (lVar19 != 4);
  uVar17 = (uint)pPVar43;
  lVar25 = 0;
LAB_01d13f10:
  uVar30 = *(uint *)(sVar10 + auStack_58[lVar25] * 4);
  puVar44 = ringbuffer + (uVar14 & uVar30);
  if (((uVar31 == puVar44[local_e8]) && (pPVar43 != (PreparedDictionary *)(ulong)uVar30)) &&
     (pPVar20 = (PreparedDictionary *)((long)pPVar43 - (long)(ulong)uVar30), pPVar20 <= pPVar23)) {
    puVar47 = puVar44;
    uVar42 = uVar22;
    puVar18 = puVar3;
    if (7 < uVar22) {
      lVar40 = 0;
      lVar19 = 0;
LAB_01d13f67:
      if (*(ulong *)(puVar3 + lVar40) == *(ulong *)(puVar44 + lVar40)) goto code_r0x01d13f74;
      uVar26 = *(ulong *)(puVar44 + lVar40) ^ *(ulong *)(puVar3 + lVar40);
      uVar42 = 0;
      if (uVar26 != 0) {
        for (; (uVar26 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
        }
      }
      uVar42 = (uVar42 >> 3 & 0x1fffffff) - lVar19;
      goto LAB_01d13fe1;
    }
    goto LAB_01d13f99;
  }
  goto LAB_01d1401e;
code_r0x01d13f74:
  lVar40 = lVar40 + 8;
  lVar34 = uVar22 + lVar19;
  lVar19 = lVar19 + -8;
  if (lVar34 - 8U < 8) goto code_r0x01d13f8a;
  goto LAB_01d13f67;
code_r0x01d13f8a:
  puVar47 = puVar44 + -lVar19;
  puVar18 = puVar3 + -lVar19;
  uVar42 = lVar19 + uVar22;
LAB_01d13f99:
  if (uVar42 != 0) {
    uVar26 = 0;
    do {
      uVar29 = uVar26;
      if (puVar47[uVar26] != puVar18[uVar26]) break;
      uVar26 = uVar26 + 1;
      uVar29 = uVar42;
    } while (uVar42 != uVar26);
    puVar47 = puVar47 + uVar29;
  }
  uVar42 = (long)puVar47 - (long)puVar44;
LAB_01d13fe1:
  if (3 < uVar42) {
    iVar24 = 0x1f;
    if ((uint)pPVar20 != 0) {
      for (; (uint)pPVar20 >> iVar24 == 0; iVar24 = iVar24 + -1) {
      }
    }
    uVar26 = (ulong)(iVar24 * -0x1e + 0x780) + uVar42 * 0x87;
    if (local_108 < uVar26) {
      uVar31 = puVar3[uVar42];
      local_e8 = uVar42;
      local_118 = pPVar20;
      local_108 = uVar26;
    }
  }
LAB_01d1401e:
  lVar25 = lVar25 + 1;
  if (lVar25 == 4) goto code_r0x01d1402b;
  goto LAB_01d13f10;
code_r0x01d1402b:
  *(uint *)(sVar10 + *(long *)((long)auStack_58 + (ulong)(uVar17 & 0x18)) * 4) = uVar17;
  if (0x1f < uVar22 && ((ulong)pPVar43 & 3) == 0) {
    pPVar20 = (params->dictionary).compound.chunks[1];
    if (pPVar20 <= pPVar43) {
      uVar30 = (uint)(params->dictionary).compound.total_size;
      iVar24 = *(int *)((long)(params->dictionary).compound.chunks + 0x14);
      iVar7 = *(int *)((params->dictionary).compound.chunks + 3);
LAB_01d1408f:
      uVar37 = uVar30 & 0x3fffffff;
      bVar21 = ringbuffer[(ulong)pPVar20 & ringbuffer_mask];
      bVar6 = ringbuffer[(ulong)&pPVar20[1].source_size & ringbuffer_mask];
      if (uVar37 < 0x1000000) {
        pPVar11 = (params->dictionary).compound.chunks[0];
        uVar32 = (&pPVar11->magic)[uVar37];
        (&pPVar11->magic)[uVar37] = (uint32_t)pPVar20;
        if ((pPVar20 == pPVar43) && (uVar32 != 0xffffffff)) {
          uVar37 = uVar17 - uVar32;
          if ((PreparedDictionary *)(ulong)uVar37 <= pPVar23) {
            puVar44 = ringbuffer + (uVar32 & uVar14);
            lVar40 = 0;
            lVar25 = 0;
LAB_01d14113:
            lVar19 = lVar25;
            if (*(ulong *)(puVar3 + lVar40) == *(ulong *)(puVar44 + lVar40)) goto code_r0x01d14123;
            uVar26 = *(ulong *)(puVar44 + lVar40) ^ *(ulong *)(puVar3 + lVar40);
            uVar42 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
              }
            }
            uVar42 = lVar40 + (uVar42 >> 3 & 0x1fffffff);
            goto LAB_01d1418b;
          }
        }
      }
      goto LAB_01d140dd;
    }
    goto LAB_01d141f6;
  }
  goto LAB_01d1420c;
code_r0x01d14123:
  lVar40 = lVar40 + 8;
  lVar25 = lVar19 + -8;
  if ((uVar22 + lVar19) - 8 < 8) goto code_r0x01d14139;
  goto LAB_01d14113;
code_r0x01d14139:
  if (uVar22 - lVar40 == 0) {
    puVar47 = puVar44 + lVar40;
  }
  else {
    puVar47 = puVar44 + (uVar22 - lVar40) + lVar40;
    uVar42 = 8 - lVar19;
    do {
      if (puVar44[uVar42] != puVar3[uVar42]) {
        puVar47 = puVar44 + uVar42;
        break;
      }
      uVar42 = uVar42 + 1;
    } while (uVar22 != uVar42);
  }
  uVar42 = (long)puVar47 - (long)puVar44;
LAB_01d1418b:
  if ((3 < uVar42) && (local_e8 < uVar42)) {
    iVar12 = 0x1f;
    if (uVar37 != 0) {
      for (; uVar37 >> iVar12 == 0; iVar12 = iVar12 + -1) {
      }
    }
    uVar26 = (ulong)(iVar12 * -0x1e + 0x780) + uVar42 * 0x87;
    if (local_108 < uVar26) {
      local_118 = (PreparedDictionary *)(ulong)uVar37;
      local_108 = uVar26;
      local_e8 = uVar42;
    }
  }
LAB_01d140dd:
  uVar30 = ~(uint)bVar21 * iVar7 + (uint)bVar6 + uVar30 * iVar24 + 1;
  pPVar20 = (PreparedDictionary *)&pPVar20->num_items;
  if (pPVar43 < pPVar20) goto LAB_01d141e3;
  goto LAB_01d1408f;
LAB_01d141e3:
  *(uint *)&(params->dictionary).compound.total_size = uVar30;
LAB_01d141f6:
  (params->dictionary).compound.chunks[1] = (PreparedDictionary *)&pPVar43->num_items;
LAB_01d1420c:
  if (0x7e4 < local_108) {
    uVar42 = local_148 + 4;
    lVar25 = (lVar4 + num_bytes) - (long)pPVar43;
    local_dc = 0;
LAB_01d14239:
    uVar26 = uVar22 - 1;
    local_c0 = local_e8 - 1;
    if (uVar26 <= local_e8 - 1) {
      local_c0 = uVar26;
    }
    if (4 < *(int *)(literal_context_lut + 4)) {
      local_c0 = 0;
    }
    pPVar28 = (PreparedDictionary *)((long)&pPVar43->magic + 1);
    pPVar23 = pPVar33;
    if (pPVar28 < pPVar33) {
      pPVar23 = pPVar28;
    }
    puVar3 = ringbuffer + ((ulong)pPVar28 & ringbuffer_mask);
    uVar31 = puVar3[local_c0];
    local_140 = (PreparedDictionary *)(long)*(int *)(hasher->common).extra;
    local_100 = 0x7e4;
    if (((PreparedDictionary *)((long)pPVar28 - (long)local_140) < pPVar28) &&
       (puVar44 = ringbuffer +
                  ((uint)(PreparedDictionary *)((long)pPVar28 - (long)local_140) & uVar14),
       uVar31 == puVar44[local_c0])) {
      puVar47 = puVar3;
      puVar18 = puVar44;
      uVar29 = uVar26;
      if (7 < uVar26) {
        lVar40 = 0;
        lVar19 = 0;
LAB_01d142e6:
        if (*(ulong *)(puVar3 + lVar40) == *(ulong *)(puVar44 + lVar40)) goto code_r0x01d142f4;
        uVar46 = *(ulong *)(puVar44 + lVar40) ^ *(ulong *)(puVar3 + lVar40);
        uVar29 = 0;
        if (uVar46 != 0) {
          for (; (uVar46 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        uVar29 = (uVar29 >> 3 & 0x1fffffff) - lVar19;
        goto LAB_01d1435c;
      }
      goto LAB_01d14319;
    }
    goto LAB_01d1438b;
  }
  local_148 = local_148 + 1;
  position = (long)&pPVar43->magic + 1;
  if (pPVar28 < position) {
    if ((PreparedDictionary *)((long)&pPVar28->magic + (ulong)(uint)((int)lVar39 * 4)) < position) {
      pPVar43 = (PreparedDictionary *)((long)&pPVar43->bucket_bits + 1);
      if (pPVar5 <= pPVar43) {
        pPVar43 = pPVar5;
      }
      for (; position < pPVar43; position = (size_t)&((PreparedDictionary *)position)->num_items) {
        *(uint *)(sVar10 + (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                           (position & ringbuffer_mask)) *
                                                 -0x1ca5842ca8642d00) >> 0x2c) +
                                   ((uint)position & 0x18) & 0xfffff) * 4) = (uint)position;
        local_148 = local_148 + 4;
      }
    }
    else {
      pPVar43 = (PreparedDictionary *)((long)&pPVar43->source_size + 1);
      if (pPVar5 <= pPVar43) {
        pPVar43 = pPVar5;
      }
      for (; position < pPVar43; position = (long)&((PreparedDictionary *)position)->magic + 2) {
        *(uint *)(sVar10 + (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                           (position & ringbuffer_mask)) *
                                                 -0x1ca5842ca8642d00) >> 0x2c) +
                                   ((uint)position & 0x18) & 0xfffff) * 4) = (uint)position;
        local_148 = local_148 + 2;
      }
    }
  }
LAB_01d14b79:
  pPVar43 = (PreparedDictionary *)position;
  if (puVar2 <= &((PreparedDictionary *)position)->source_size) goto LAB_01d14bee;
  goto LAB_01d13d80;
code_r0x01d142f4:
  lVar40 = lVar40 + 8;
  lVar34 = lVar25 + lVar19;
  lVar19 = lVar19 + -8;
  if (lVar34 - 8U < 8) goto code_r0x01d1430a;
  goto LAB_01d142e6;
code_r0x01d1430a:
  puVar18 = puVar44 + -lVar19;
  puVar47 = puVar3 + -lVar19;
  uVar29 = lVar19 + lVar25;
LAB_01d14319:
  if (uVar29 != 0) {
    uVar46 = 0;
    do {
      uVar13 = uVar46;
      if (puVar18[uVar46] != puVar47[uVar46]) break;
      uVar46 = uVar46 + 1;
      uVar13 = uVar29;
    } while (uVar29 != uVar46);
    puVar18 = puVar18 + uVar13;
  }
  uVar29 = (long)puVar18 - (long)puVar44;
LAB_01d1435c:
  if ((uVar29 < 4) || (uVar46 = uVar29 * 0x87 + 0x78f, uVar46 < 0x7e5)) {
LAB_01d1438b:
    local_140 = (PreparedDictionary *)0x0;
  }
  else {
    uVar31 = puVar3[uVar29];
    local_c0 = uVar29;
    local_100 = uVar46;
  }
  uVar17 = (uint)((ulong)(*(long *)(ringbuffer + ((ulong)pPVar28 & ringbuffer_mask)) *
                         -0x1ca5842ca8642d00) >> 0x2c);
  lVar34 = 0;
  lVar40 = 0;
  lVar19 = 1;
  do {
    auStack_58[lVar34] = lVar40 * 8 + (ulong)uVar17 & 0xfffff;
    auStack_58[lVar34 + 1] = lVar19 * 8 + (ulong)uVar17 & 0xfffff;
    lVar34 = lVar34 + 2;
    lVar40 = lVar40 + 2;
    lVar19 = lVar19 + 2;
  } while (lVar34 != 4);
  uVar17 = (uint)pPVar28;
  lVar40 = 0;
LAB_01d14403:
  uVar30 = *(uint *)(sVar10 + auStack_58[lVar40] * 4);
  puVar44 = ringbuffer + (uVar14 & uVar30);
  if (((uVar31 == puVar44[local_c0]) && (pPVar28 != (PreparedDictionary *)(ulong)uVar30)) &&
     (pPVar20 = (PreparedDictionary *)((long)pPVar28 - (long)(ulong)uVar30), pPVar20 <= pPVar23)) {
    puVar47 = puVar3;
    puVar18 = puVar44;
    uVar29 = uVar26;
    if (7 < uVar26) {
      lVar19 = 0;
      lVar34 = 0;
LAB_01d1445d:
      if (*(ulong *)(puVar3 + lVar19) == *(ulong *)(puVar44 + lVar19)) goto code_r0x01d1446b;
      uVar46 = *(ulong *)(puVar44 + lVar19) ^ *(ulong *)(puVar3 + lVar19);
      uVar29 = 0;
      if (uVar46 != 0) {
        for (; (uVar46 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
        }
      }
      uVar29 = (uVar29 >> 3 & 0x1fffffff) - lVar34;
      goto LAB_01d144d2;
    }
    goto LAB_01d14490;
  }
  goto LAB_01d1450b;
code_r0x01d1446b:
  lVar19 = lVar19 + 8;
  lVar27 = lVar25 + lVar34;
  lVar34 = lVar34 + -8;
  if (lVar27 - 8U < 8) goto code_r0x01d14481;
  goto LAB_01d1445d;
code_r0x01d14481:
  puVar18 = puVar44 + -lVar34;
  puVar47 = puVar3 + -lVar34;
  uVar29 = lVar34 + lVar25;
LAB_01d14490:
  if (uVar29 != 0) {
    uVar46 = 0;
    do {
      uVar13 = uVar46;
      if (puVar18[uVar46] != puVar47[uVar46]) break;
      uVar46 = uVar46 + 1;
      uVar13 = uVar29;
    } while (uVar29 != uVar46);
    puVar18 = puVar18 + uVar13;
  }
  uVar29 = (long)puVar18 - (long)puVar44;
LAB_01d144d2:
  if (3 < uVar29) {
    iVar24 = 0x1f;
    if ((uint)pPVar20 != 0) {
      for (; (uint)pPVar20 >> iVar24 == 0; iVar24 = iVar24 + -1) {
      }
    }
    uVar46 = (ulong)(iVar24 * -0x1e + 0x780) + uVar29 * 0x87;
    if (local_100 < uVar46) {
      uVar31 = puVar3[uVar29];
      local_c0 = uVar29;
      local_140 = pPVar20;
      local_100 = uVar46;
    }
  }
LAB_01d1450b:
  lVar40 = lVar40 + 1;
  if (lVar40 == 4) goto code_r0x01d14518;
  goto LAB_01d14403;
code_r0x01d14518:
  *(uint *)(sVar10 + *(long *)((long)auStack_58 + (ulong)(uVar17 & 0x18)) * 4) = uVar17;
  if (uVar26 < 0x20 || ((ulong)pPVar28 & 3) != 0) goto LAB_01d1470c;
  pPVar20 = (params->dictionary).compound.chunks[1];
  if (pPVar20 <= pPVar28) {
    uVar30 = (uint)(params->dictionary).compound.total_size;
    iVar24 = *(int *)((long)(params->dictionary).compound.chunks + 0x14);
    iVar7 = *(int *)((params->dictionary).compound.chunks + 3);
LAB_01d1457d:
    uVar37 = uVar30 & 0x3fffffff;
    bVar21 = ringbuffer[(ulong)pPVar20 & ringbuffer_mask];
    bVar6 = ringbuffer[(ulong)&pPVar20[1].source_size & ringbuffer_mask];
    if (uVar37 < 0x1000000) {
      pPVar11 = (params->dictionary).compound.chunks[0];
      uVar32 = (&pPVar11->magic)[uVar37];
      (&pPVar11->magic)[uVar37] = (uint32_t)pPVar20;
      if ((pPVar20 == pPVar28) && (uVar32 != 0xffffffff)) {
        uVar37 = uVar17 - uVar32;
        if ((PreparedDictionary *)(ulong)uVar37 <= pPVar23) {
          puVar44 = ringbuffer + (uVar32 & uVar14);
          lVar19 = 0;
          lVar40 = 0;
LAB_01d145fc:
          lVar34 = lVar40;
          if (*(ulong *)(puVar3 + lVar34) == *(ulong *)(puVar44 + lVar34)) goto code_r0x01d1460a;
          uVar46 = *(ulong *)(puVar44 + lVar34) ^ *(ulong *)(puVar3 + lVar34);
          uVar29 = 0;
          if (uVar46 != 0) {
            for (; (uVar46 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
            }
          }
          uVar29 = (uVar29 >> 3 & 0x1fffffff) + lVar34;
          goto LAB_01d14686;
        }
      }
    }
    goto LAB_01d145cb;
  }
  goto LAB_01d146fa;
code_r0x01d1460a:
  lVar40 = lVar34 + 8;
  lVar27 = uVar22 + lVar19;
  lVar19 = lVar19 + -8;
  if (lVar27 - 9U < 8) goto code_r0x01d14629;
  goto LAB_01d145fc;
code_r0x01d14629:
  puVar47 = puVar44 + lVar40;
  puVar18 = puVar47;
  if (lVar34 + 9U != uVar22) {
    puVar41 = puVar3 + lVar40;
    lVar40 = lVar19 + uVar22 + -1;
    do {
      puVar18 = puVar47;
      if (*puVar47 != *puVar41) break;
      puVar41 = puVar41 + 1;
      puVar47 = puVar47 + 1;
      lVar40 = lVar40 + -1;
      puVar18 = puVar44 + (uVar22 - 1);
    } while (lVar40 != 0);
  }
  uVar29 = (long)puVar18 - (long)puVar44;
LAB_01d14686:
  if ((3 < uVar29) && (local_c0 < uVar29)) {
    iVar12 = 0x1f;
    if (uVar37 != 0) {
      for (; uVar37 >> iVar12 == 0; iVar12 = iVar12 + -1) {
      }
    }
    uVar46 = (ulong)(iVar12 * -0x1e + 0x780) + uVar29 * 0x87;
    if (local_100 < uVar46) {
      local_140 = (PreparedDictionary *)(ulong)uVar37;
      local_100 = uVar46;
      local_c0 = uVar29;
    }
  }
LAB_01d145cb:
  uVar30 = ~(uint)bVar21 * iVar7 + (uint)bVar6 + uVar30 * iVar24 + 1;
  pPVar20 = (PreparedDictionary *)&pPVar20->num_items;
  if (pPVar28 < pPVar20) goto LAB_01d146ec;
  goto LAB_01d1457d;
LAB_01d146ec:
  *(uint *)&(params->dictionary).compound.total_size = uVar30;
LAB_01d146fa:
  (params->dictionary).compound.chunks[1] = (PreparedDictionary *)((long)&pPVar43->num_items + 1);
LAB_01d1470c:
  pPVar23 = pPVar43;
  uVar29 = local_148;
  if ((local_100 < local_108 + 0xaf) ||
     (local_118 = local_140, pPVar23 = pPVar28, local_e8 = local_c0, uVar29 = uVar42, local_dc == 3)
     ) goto LAB_01d14815;
  local_148 = local_148 + 1;
  local_dc = local_dc + 1;
  puVar16 = &pPVar43->source_size;
  lVar25 = lVar25 + -1;
  local_108 = local_100;
  pPVar43 = pPVar28;
  uVar22 = uVar26;
  uVar29 = local_148;
  if (puVar2 <= (undefined1 *)((long)puVar16 + 1)) goto LAB_01d14815;
  goto LAB_01d14239;
LAB_01d14815:
  local_148 = uVar29;
  pPVar28 = (PreparedDictionary *)((long)&pPVar23->magic + lVar8);
  if (pPVar33 <= pPVar28) {
    pPVar28 = pPVar33;
  }
  pPVar28 = (PreparedDictionary *)((long)&pPVar28->magic + lVar9);
  uVar30 = (uint)local_e8;
  uVar17 = (uint)local_148;
  if (pPVar28 < local_118) {
LAB_01d14848:
    puVar45 = (undefined1 *)((long)&local_118->hash_bits + 3);
LAB_01d1484c:
    if ((local_118 <= pPVar28) && (puVar45 != (undefined1 *)0x0)) {
      *(undefined4 *)((long)(hasher->common).extra + 0xc) =
           *(undefined4 *)((hasher->common).extra + 1);
      *(void **)((long)(hasher->common).extra + 4) = (hasher->common).extra[0];
      *(int *)(hasher->common).extra = (int)local_118;
    }
    *(uint *)local_f0 = uVar17;
    *(uint *)((long)local_f0 + 4) = uVar30;
    puVar1 = (undefined1 *)((ulong)*(uint *)(literal_context_lut + 0x3c) + 0x10);
    uVar37 = 0;
    if (puVar1 <= puVar45) {
      bVar21 = (byte)*(uint *)(literal_context_lut + 0x38);
      puVar35 = puVar45 + ((4L << (bVar21 & 0x3f)) - (ulong)*(uint *)(literal_context_lut + 0x3c)) +
                          -0x10;
      uVar37 = 0x1f;
      uVar32 = (uint)puVar35;
      if (uVar32 != 0) {
        for (; uVar32 >> uVar37 == 0; uVar37 = uVar37 - 1) {
        }
      }
      uVar37 = (uVar37 ^ 0xffffffe0) + 0x1f;
      uVar22 = (ulong)(((ulong)puVar35 >> ((ulong)uVar37 & 0x3f) & 1) != 0);
      lVar25 = (ulong)uVar37 - (ulong)*(uint *)(literal_context_lut + 0x38);
      puVar45 = (undefined1 *)
                ((ulong)(puVar1 + (uVar22 + lVar25 * 2 + 0xfffe << (bVar21 & 0x3f)) +
                                  (ulong)(~(-1 << (bVar21 & 0x1f)) & uVar32)) | lVar25 * 0x400);
      uVar37 = (uint)((long)puVar35 - (uVar22 + 2 << ((byte)uVar37 & 0x3f)) >> (bVar21 & 0x3f));
    }
    uVar32 = (uint)puVar45;
  }
  else {
    pPVar43 = (PreparedDictionary *)(long)*(int *)(hasher->common).extra;
    if (local_118 != pPVar43) {
      pPVar20 = (PreparedDictionary *)(long)*(int *)((long)(hasher->common).extra + 4);
      puVar45 = &DAT_00000001;
      if (local_118 != pPVar20) {
        uVar22 = (long)local_118 + (3 - (long)pPVar43);
        if (uVar22 < 7) {
          bVar21 = (byte)((int)uVar22 << 2);
          uVar37 = 0x9750468;
        }
        else {
          uVar22 = (long)local_118 + (3 - (long)pPVar20);
          if (6 < uVar22) {
            puVar45 = (undefined1 *)0x2;
            if ((local_118 != (PreparedDictionary *)(long)*(int *)((hasher->common).extra + 1)) &&
               (puVar45 = (undefined1 *)0x3,
               local_118 != (PreparedDictionary *)(long)*(int *)((long)(hasher->common).extra + 0xc)
               )) goto LAB_01d14848;
            goto LAB_01d1484c;
          }
          bVar21 = (byte)((int)uVar22 << 2);
          uVar37 = 0xfdb1ace;
        }
        puVar45 = (undefined1 *)(ulong)(uVar37 >> (bVar21 & 0x1f) & 0xf);
      }
      goto LAB_01d1484c;
    }
    *(uint *)local_f0 = uVar17;
    *(uint *)((long)local_f0 + 4) = uVar30;
    uVar32 = 0;
    uVar37 = 0;
  }
  *(short *)((long)local_f0 + 0xe) = (short)uVar32;
  *(uint *)(local_f0 + 1) = uVar37;
  if (5 < local_148) {
    if (local_148 < 0x82) {
      uVar17 = 0x1f;
      uVar37 = (uint)(local_148 - 2);
      if (uVar37 != 0) {
        for (; uVar37 >> uVar17 == 0; uVar17 = uVar17 - 1) {
        }
      }
      uVar17 = (int)(local_148 - 2 >> ((char)(uVar17 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar17 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_148 < 0x842) {
      uVar37 = 0x1f;
      if (uVar17 - 0x42 != 0) {
        for (; uVar17 - 0x42 >> uVar37 == 0; uVar37 = uVar37 - 1) {
        }
      }
      uVar17 = (uVar37 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar17 = 0x15;
      if (0x1841 < local_148) {
        uVar17 = (uint)(ushort)(0x17 - (local_148 < 0x5842));
      }
    }
  }
  uVar22 = (ulong)(int)uVar30;
  if (uVar22 < 10) {
    uVar37 = uVar30 - 2;
  }
  else if (uVar22 < 0x86) {
    uVar30 = 0x1f;
    uVar37 = (uint)(uVar22 - 6);
    if (uVar37 != 0) {
      for (; uVar37 >> uVar30 == 0; uVar30 = uVar30 - 1) {
      }
    }
    uVar37 = (int)(uVar22 - 6 >> ((char)(uVar30 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
             (uVar30 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar37 = 0x17;
    if (uVar22 < 0x846) {
      uVar37 = 0x1f;
      if (uVar30 - 0x46 != 0) {
        for (; uVar30 - 0x46 >> uVar37 == 0; uVar37 = uVar37 - 1) {
        }
      }
      uVar37 = (uVar37 ^ 0xffe0) + 0x2c;
    }
  }
  uVar15 = (ushort)uVar37;
  uVar36 = (uVar15 & 7) + ((ushort)uVar17 & 7) * 8;
  if ((((uVar32 & 0x3ff) == 0) && ((ushort)uVar17 < 8)) && (uVar15 < 0x10)) {
    if (7 < uVar15) {
      uVar36 = uVar36 | 0x40;
    }
  }
  else {
    iVar24 = ((uVar17 & 0xffff) >> 3) * 3 + ((uVar37 & 0xffff) >> 3);
    uVar36 = uVar36 + ((ushort)(0x520d40 >> ((char)iVar24 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar24 * 0x40 + 0x40;
  }
  *(ushort *)((long)local_f0 + 0xc) = uVar36;
  *num_commands = *num_commands + local_148;
  position = (long)&pPVar23->magic + local_e8;
  pPVar43 = pPVar38;
  if (position < pPVar38) {
    pPVar43 = (PreparedDictionary *)position;
  }
  pPVar20 = (PreparedDictionary *)((long)&pPVar23->magic + 2);
  if (local_118 < (PreparedDictionary *)(local_e8 >> 2)) {
    pPVar28 = (PreparedDictionary *)(position + (long)local_118 * -4);
    if (pPVar28 < pPVar20) {
      pPVar28 = pPVar20;
    }
    pPVar20 = pPVar28;
    if (pPVar43 < pPVar28) {
      pPVar20 = pPVar43;
    }
  }
  pPVar28 = (PreparedDictionary *)((long)&pPVar23->magic + local_e8 * 2 + lVar39);
  local_f0 = local_f0 + 2;
  if (pPVar20 < pPVar43) {
    do {
      *(uint *)(sVar10 + (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                         ((ulong)pPVar20 & ringbuffer_mask)) *
                                               -0x1ca5842ca8642d00) >> 0x2c) +
                                 ((uint)pPVar20 & 0x18) & 0xfffff) * 4) = (uint)pPVar20;
      pPVar20 = (PreparedDictionary *)((long)&pPVar20->magic + 1);
    } while (pPVar43 != pPVar20);
  }
  local_148 = 0;
  goto LAB_01d14b79;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}